

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool __thiscall MipsParser::parseVpfxsParameter(MipsParser *this,Parser *parser,int *result)

{
  byte bVar1;
  Token *pTVar2;
  void *pvVar3;
  TokenType TVar4;
  TokenType TVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  TokenSequence tokens;
  TokenSequence tokens_00;
  TokenSequence tokens_01;
  TokenSequence tokens_02;
  TokenSequence tokens_03;
  TokenSequence tokens_04;
  TokenSequence tokens_05;
  TokenSequence tokens_06;
  TokenValueSequence values;
  TokenValueSequence values_00;
  TokenValueSequence values_01;
  TokenValueSequence values_02;
  TokenValueSequence values_03;
  TokenValueSequence values_04;
  TokenValueSequence values_05;
  TokenValueSequence values_06;
  int constNum;
  TokenType local_5c [3];
  TokenSequenceValue local_50;
  undefined4 local_40;
  undefined8 local_38;
  
  if (parseVpfxsParameter(Parser&,int&)::sequenceParser == '\0') {
    parseVpfxsParameter();
  }
  if (parseVpfxsParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      parseVpfxsParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_5c[0] = Integer;
    local_50.type = Integer;
    local_50.field_1.textValue = (char *)0x0;
    tokens._M_len = 1;
    tokens._M_array = local_5c;
    values._M_len = 1;
    values._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,0,tokens,values);
    local_5c[0] = Integer;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    tokens_00._M_len = 1;
    tokens_00._M_array = local_5c;
    values_00._M_len = 1;
    values_00._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,1,tokens_00,values_00);
    local_5c[0] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 2;
    tokens_01._M_len = 1;
    tokens_01._M_array = local_5c;
    values_01._M_len = 1;
    values_01._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,2,tokens_01,values_01);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_5c[2] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    local_40 = 2;
    local_38 = 2;
    tokens_02._M_len = 3;
    tokens_02._M_array = local_5c;
    values_02._M_len = 2;
    values_02._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,3,tokens_02,values_02);
    local_5c[0] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 3;
    tokens_03._M_len = 1;
    tokens_03._M_array = local_5c;
    values_03._M_len = 1;
    values_03._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,4,tokens_03,values_03);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_5c[2] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    local_40 = 2;
    local_38 = 3;
    tokens_04._M_len = 3;
    tokens_04._M_array = local_5c;
    values_04._M_len = 2;
    values_04._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,5,tokens_04,values_04);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_5c[2] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    local_40 = 2;
    local_38 = 4;
    tokens_05._M_len = 3;
    tokens_05._M_array = local_5c;
    values_05._M_len = 2;
    values_05._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,6,tokens_05,values_05);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_5c[2] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    local_40 = 2;
    local_38 = 6;
    tokens_06._M_len = 3;
    tokens_06._M_array = local_5c;
    values_06._M_len = 2;
    values_06._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,7,tokens_06,values_06);
  }
  pTVar2 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if (pTVar2->type == LBrack) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      pTVar2 = Tokenizer::nextToken
                         ((parser->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      if (lVar7 != 0) {
        if (pTVar2->type != Comma) goto LAB_00168417;
        pTVar2 = Tokenizer::nextToken
                           ((parser->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      }
      TVar5 = pTVar2->type;
      bVar1 = (byte)lVar6;
      if (TVar5 == Minus) {
        *result = *result | 0x10000 << (bVar1 & 0x1f);
        pTVar2 = Tokenizer::nextToken
                           ((parser->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
        TVar5 = pTVar2->type;
      }
      TVar4 = TVar5;
      if (TVar5 == BitOr) {
        *result = *result | 0x100 << (bVar1 & 0x1f);
        pTVar2 = Tokenizer::nextToken
                           ((parser->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
        TVar4 = pTVar2->type;
      }
      if (TVar4 != Identifier) goto LAB_00168417;
      if (*(__index_type *)
           ((long)&(pTVar2->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 0x20) != '\x04') {
        __assert_fail("std::holds_alternative<Identifier>(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                      ,0x4d,"const Identifier &Token::identifierValue() const");
      }
      if ((*(long *)((long)&(pTVar2->value).
                            super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    + 8) == 1) &&
         (pvVar3 = memchr("xyzw",(int)**(char **)&(pTVar2->value).
                                                  super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  ._M_u,5), pvVar3 != (void *)0x0)) {
        *result = *result | (int)pvVar3 + -0x18fb54 << ((byte)lVar7 & 0x3f);
        if ((TVar5 == BitOr) &&
           (pTVar2 = Tokenizer::nextToken
                               ((parser->entries).
                                super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer),
           pTVar2->type != BitOr)) goto LAB_00168417;
      }
      else {
        if (TVar5 == BitOr) goto LAB_00168417;
        *result = *result | 0x1000 << (bVar1 & 0x1f);
        local_50.type = ~Invalid;
        bVar8 = TokenSequenceParser::parse
                          (&parseVpfxsParameter::sequenceParser,parser,(int *)&local_50);
        if (!bVar8) goto LAB_00168417;
        *result = 0x100 << (bVar1 & 0x1f) & (int)(local_50.type << 0x1d) >> 0x1f |
                  (local_50.type & String) << ((byte)lVar7 & 0x1f) | *result;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 2;
    } while (lVar6 != 4);
    pTVar2 = Tokenizer::nextToken
                       ((parser->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    bVar8 = pTVar2->type == RBrack;
  }
  else {
LAB_00168417:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool MipsParser::parseVpfxsParameter(Parser& parser, int& result)
{
	static TokenSequenceParser sequenceParser;

	// initialize on first use
	if (sequenceParser.getEntryCount() == 0)
	{
		// 0
		sequenceParser.addEntry(0, {TokenType::Integer}, {INT64_C(0)} );
		// 1
		sequenceParser.addEntry(1, {TokenType::Integer}, {INT64_C(1)} );
		// 2
		sequenceParser.addEntry(2, {TokenType::Integer}, {INT64_C(2)} );
		// 1/2
		sequenceParser.addEntry(3, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(2)} );
		// 3
		sequenceParser.addEntry(4, {TokenType::Integer}, {INT64_C(3)} );
		// 1/3
		sequenceParser.addEntry(5, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(3)} );
		// 1/4
		sequenceParser.addEntry(6, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(4)} );
		// 1/6
		sequenceParser.addEntry(7, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(6)} );
	}

	if (parser.nextToken().type != TokenType::LBrack)
		return false;
	
	for (int i = 0; i < 4; i++)
	{
		const Token *tokenFinder = &parser.nextToken();

		if (i != 0)
		{
			if (tokenFinder->type != TokenType::Comma)
				return false;

			tokenFinder = &parser.nextToken();
		}
		
		// negation
		if (tokenFinder->type == TokenType::Minus)
		{
			result |= 1 << (16+i);
			tokenFinder = &parser.nextToken();
		}

		// abs
		bool abs = false;
		if (tokenFinder->type == TokenType::BitOr)
		{
			result |= 1 << (8+i);
			abs = true;
			tokenFinder = &parser.nextToken();
		}

		const Token& token = *tokenFinder;
		if (token.type != TokenType::Identifier)
			return false;

		// check for register
		const char* reg;
		static const char* vpfxstRegisters = "xyzw";
		const std::string &stringValue = token.identifierValue().string();
		if (stringValue.size() == 1 && (reg = strchr(vpfxstRegisters,stringValue[0])) != nullptr)
		{
			result |= (reg-vpfxstRegisters) << (i*2);

			if (abs && parser.nextToken().type != TokenType::BitOr)
				return false;

			continue;
		}
		
		// abs is invalid with constants
		if (abs)
			return false;

		result |= 1 << (12+i);

		int constNum = -1;
		if (!sequenceParser.parse(parser,constNum))
			return false;
		
		result |= (constNum & 3) << (i*2);
		if (constNum & 4)
			result |= 1 << (8+i);
	}

	return parser.nextToken().type == TokenType::RBrack;
}